

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::subcase_start(JUnitReporter *this,SubcaseSignature *in)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  SubcaseSignature *in_local;
  JUnitReporter *this_local;
  
  lock._M_device = (mutex_type *)in;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::push_back
            (&this->deepestSubcaseStackNames,(value_type *)lock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& in) override {
            std::lock_guard<std::mutex> lock(mutex);
            deepestSubcaseStackNames.push_back(in.m_name);
        }